

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O3

float * glfwGetJoystickAxes(int joy,int *count)

{
  float *pfVar1;
  char *format;
  int error;
  
  *count = 0;
  if (_glfwInitialized == '\0') {
    error = 0x10001;
    format = (char *)0x0;
  }
  else {
    if ((uint)joy < 0x10) {
      pfVar1 = _glfwPlatformGetJoystickAxes(joy,count);
      return pfVar1;
    }
    format = "Invalid joystick";
    error = 0x10003;
  }
  _glfwInputError(error,format);
  return (float *)0x0;
}

Assistant:

GLFWAPI const float* glfwGetJoystickAxes(int joy, int* count)
{
    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (joy < 0 || joy > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick");
        return NULL;
    }

    return _glfwPlatformGetJoystickAxes(joy, count);
}